

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int readsTable(Parse *p,int iDb,Table *pTab)

{
  Vdbe *pVVar1;
  VTable *pVVar2;
  ulong uVar3;
  Op *pOVar4;
  Index *pIVar5;
  
  pVVar1 = sqlite3GetVdbe(p);
  if ((pTab->nModuleArg != 0) && (pVVar2 = pTab->pVTable, pVVar2 != (VTable *)0x0)) {
    do {
      if (pVVar2->db == p->db) goto LAB_001b999d;
      pVVar2 = pVVar2->pNext;
    } while (pVVar2 != (VTable *)0x0);
  }
  pVVar2 = (VTable *)0x0;
LAB_001b999d:
  if (1 < pVVar1->nOp) {
    uVar3 = 1;
    do {
      pOVar4 = (Op *)&sqlite3VdbeGetOp_dummy;
      if (pVVar1->db->mallocFailed == '\0') {
        pOVar4 = pVVar1->aOp + uVar3;
      }
      if (pOVar4->opcode == 0xa3) {
        if ((VTable *)(pOVar4->p4).p == pVVar2) {
          return 1;
        }
      }
      else if ((pOVar4->opcode == 'l') && (pOVar4->p3 == iDb)) {
        if (pOVar4->p2 == pTab->tnum) {
          return 1;
        }
        for (pIVar5 = pTab->pIndex; pIVar5 != (Index *)0x0; pIVar5 = pIVar5->pNext) {
          if (pOVar4->p2 == pIVar5->tnum) {
            return 1;
          }
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)pVVar1->nOp);
  }
  return 0;
}

Assistant:

static int readsTable(Parse *p, int iDb, Table *pTab){
  Vdbe *v = sqlite3GetVdbe(p);
  int i;
  int iEnd = sqlite3VdbeCurrentAddr(v);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  VTable *pVTab = IsVirtual(pTab) ? sqlite3GetVTable(p->db, pTab) : 0;
#endif

  for(i=1; i<iEnd; i++){
    VdbeOp *pOp = sqlite3VdbeGetOp(v, i);
    assert( pOp!=0 );
    if( pOp->opcode==OP_OpenRead && pOp->p3==iDb ){
      Index *pIndex;
      int tnum = pOp->p2;
      if( tnum==pTab->tnum ){
        return 1;
      }
      for(pIndex=pTab->pIndex; pIndex; pIndex=pIndex->pNext){
        if( tnum==pIndex->tnum ){
          return 1;
        }
      }
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( pOp->opcode==OP_VOpen && pOp->p4.pVtab==pVTab ){
      assert( pOp->p4.pVtab!=0 );
      assert( pOp->p4type==P4_VTAB );
      return 1;
    }
#endif
  }
  return 0;
}